

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,LocalFunctionStatement *l_func_stmt,void *data)

{
  pointer pSVar1;
  undefined8 in_RDI;
  CodeGenerateVisitor *unaff_retaddr;
  ExpVarData_conflict exp_var_data;
  int register_id;
  int in_stack_00000054;
  String *in_stack_00000058;
  CodeGenerateVisitor *in_stack_00000060;
  ExpVarData local_24 [3];
  
  local_24[0]._8_4_ = GenerateRegisterId(unaff_retaddr);
  InsertName(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  ExpVarData::ExpVarData(local_24,local_24[0]._8_4_,local_24[0]._8_4_ + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a1900);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,local_24);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(LocalFunctionStatement *l_func_stmt, void *data)
    {
        auto register_id = GenerateRegisterId();
        InsertName(l_func_stmt->name_.str_, register_id);
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        l_func_stmt->func_body_->Accept(this, &exp_var_data);
    }